

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmCommonTargetGenerator::GetManifests
          (string *__return_storage_ptr__,cmCommonTargetGenerator *this,string *config)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmMakefile *this_01;
  cmLocalCommonGenerator *this_02;
  bool bVar1;
  size_type __n;
  string *psVar2;
  reference ppcVar3;
  string_view source;
  string_view local_198;
  string_view local_188;
  string local_178 [32];
  string_view local_158;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  cmSourceFile *local_108;
  cmSourceFile *manifest_src;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  cmValue local_a8;
  undefined1 local_a0 [8];
  string manifestFlag;
  string lang;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  manifests;
  undefined1 local_38 [8];
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  string *config_local;
  cmCommonTargetGenerator *this_local;
  
  manifest_srcs.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)config;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  cmGeneratorTarget::GetManifests
            (this->GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38,
             (string *)
             manifest_srcs.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&lang.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  __n = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::size
                  ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(this_00,__n);
  cmGeneratorTarget::GetLinkerLanguage
            ((string *)((long)&manifestFlag.field_2 + 8),this->GeneratorTarget,
             (string *)
             manifest_srcs.
             super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage);
  this_01 = this->Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 "CMAKE_",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&manifestFlag.field_2 + 8));
  std::operator+(&local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 "_LINKER_MANIFEST_FLAG");
  local_a8 = cmMakefile::GetDefinition(this_01,&local_c8);
  psVar2 = cmValue::operator_cast_to_string_(&local_a8);
  std::__cxx11::string::string((string *)local_a0,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                     ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                      local_38);
  manifest_src = (cmSourceFile *)
                 std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                           ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                            local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                *)&manifest_src);
    if (!bVar1) break;
    ppcVar3 = __gnu_cxx::
              __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
              ::operator*(&__end1);
    local_108 = *ppcVar3;
    this_02 = this->LocalCommonGenerator;
    psVar2 = cmSourceFile::GetFullPath_abi_cxx11_(local_108);
    (*(this_02->super_cmLocalGenerator).super_cmOutputConverter._vptr_cmOutputConverter[2])
              (local_178,this_02,psVar2);
    source = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_178);
    local_158 = source;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_148,(cmOutputConverter *)this_02,source,SHELL,false);
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                   &local_148);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&lang.field_2 + 8),&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string(local_178);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_188," ");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_198);
  cmJoin(__return_storage_ptr__,
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&lang.field_2 + 8),local_188,local_198);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(manifestFlag.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&lang.field_2 + 8));
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCommonTargetGenerator::GetManifests(const std::string& config)
{
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, config);

  std::vector<std::string> manifests;
  manifests.reserve(manifest_srcs.size());

  std::string lang = this->GeneratorTarget->GetLinkerLanguage(config);
  std::string manifestFlag =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_LINKER_MANIFEST_FLAG");
  for (cmSourceFile const* manifest_src : manifest_srcs) {
    manifests.push_back(manifestFlag +
                        this->LocalCommonGenerator->ConvertToOutputFormat(
                          this->LocalCommonGenerator->MaybeRelativeToWorkDir(
                            manifest_src->GetFullPath()),
                          cmOutputConverter::SHELL));
  }

  return cmJoin(manifests, " ");
}